

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImBezierCubicClosestPointCasteljauStep
               (ImVec2 *p,ImVec2 *p_closest,ImVec2 *p_last,float *p_closest_dist2,float x1,float y1,
               float x2,float y2,float x3,float y3,float x4,float y4,float tess_tol,int level)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float x3_00;
  float y3_00;
  float x3_01;
  float y3_01;
  float x4_00;
  float y4_00;
  float local_b0;
  float local_ac;
  float y1234;
  float x1234;
  float y234;
  float x234;
  float y123;
  float x123;
  float y34;
  float x34;
  float y23;
  float x23;
  float y12;
  float x12;
  ImVec2 IStack_6c;
  float dist2;
  ImVec2 p_line;
  ImVec2 p_current;
  float d3;
  float d2;
  float dy;
  float dx;
  int level_local;
  float y4_local;
  float x4_local;
  float y3_local;
  float x3_local;
  float y2_local;
  float x2_local;
  float y1_local;
  float x1_local;
  float *p_closest_dist2_local;
  ImVec2 *p_last_local;
  ImVec2 *p_closest_local;
  ImVec2 *p_local;
  
  fVar1 = x4 - x1;
  fVar2 = y4 - y1;
  local_ac = (x2 - x4) * fVar2 + -((y2 - y4) * fVar1);
  local_b0 = (x3 - x4) * fVar2 + -((y3 - y4) * fVar1);
  if (local_ac < 0.0) {
    local_ac = -local_ac;
  }
  if (local_b0 < 0.0) {
    local_b0 = -local_b0;
  }
  if (tess_tol * (fVar1 * fVar1 + fVar2 * fVar2) <= (local_ac + local_b0) * (local_ac + local_b0)) {
    if (level < 10) {
      fVar1 = (x1 + x2) * 0.5;
      fVar2 = (y1 + y2) * 0.5;
      fVar3 = (x2 + x3) * 0.5;
      fVar4 = (y2 + y3) * 0.5;
      x3_00 = (x3 + x4) * 0.5;
      y3_00 = (y3 + y4) * 0.5;
      x3_01 = (fVar1 + fVar3) * 0.5;
      y3_01 = (fVar2 + fVar4) * 0.5;
      fVar3 = (fVar3 + x3_00) * 0.5;
      fVar4 = (fVar4 + y3_00) * 0.5;
      x4_00 = (x3_01 + fVar3) * 0.5;
      y4_00 = (y3_01 + fVar4) * 0.5;
      ImBezierCubicClosestPointCasteljauStep
                (p,p_closest,p_last,p_closest_dist2,x1,y1,fVar1,fVar2,x3_01,y3_01,x4_00,y4_00,
                 tess_tol,level + 1);
      ImBezierCubicClosestPointCasteljauStep
                (p,p_closest,p_last,p_closest_dist2,x4_00,y4_00,fVar3,fVar4,x3_00,y3_00,x4,y4,
                 tess_tol,level + 1);
    }
  }
  else {
    ImVec2::ImVec2(&p_line,x4,y4);
    IStack_6c = ImLineClosestPoint(p_last,&p_line,p);
    _y12 = operator-(p,&stack0xffffffffffffff94);
    fVar1 = ImLengthSqr((ImVec2 *)&y12);
    if (fVar1 < *p_closest_dist2) {
      *p_closest = IStack_6c;
      *p_closest_dist2 = fVar1;
    }
    *p_last = p_line;
  }
  return;
}

Assistant:

static void ImBezierCubicClosestPointCasteljauStep(const ImVec2& p, ImVec2& p_closest, ImVec2& p_last, float& p_closest_dist2, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = ((x2 - x4) * dy - (y2 - y4) * dx);
    float d3 = ((x3 - x4) * dy - (y3 - y4) * dx);
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2 + d3) * (d2 + d3) < tess_tol * (dx * dx + dy * dy))
    {
        ImVec2 p_current(x4, y4);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2)*0.5f,       y12 = (y1 + y2)*0.5f;
        float x23 = (x2 + x3)*0.5f,       y23 = (y2 + y3)*0.5f;
        float x34 = (x3 + x4)*0.5f,       y34 = (y3 + y4)*0.5f;
        float x123 = (x12 + x23)*0.5f,    y123 = (y12 + y23)*0.5f;
        float x234 = (x23 + x34)*0.5f,    y234 = (y23 + y34)*0.5f;
        float x1234 = (x123 + x234)*0.5f, y1234 = (y123 + y234)*0.5f;
        ImBezierCubicClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, x1, y1, x12, y12, x123, y123, x1234, y1234, tess_tol, level + 1);
        ImBezierCubicClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, x1234, y1234, x234, y234, x34, y34, x4, y4, tess_tol, level + 1);
    }
}